

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugAbbrev.cpp
# Opt level: O2

void __thiscall llvm::DWARFDebugAbbrev::DWARFDebugAbbrev(DWARFDebugAbbrev *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->AbbrDeclSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->AbbrDeclSets)._M_t._M_impl.super__Rb_tree_header;
  (this->AbbrDeclSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->AbbrDeclSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->AbbrDeclSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Data).Storage.hasVal = false;
  (this->AbbrDeclSets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->PrevAbbrOffsetPos)._M_node = (_Base_ptr)0x0;
  (this->Data).Storage.field_0.empty = '\0';
  clear(this);
  return;
}

Assistant:

DWARFDebugAbbrev::DWARFDebugAbbrev() { clear(); }